

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void duckdb::BitpackingCompressionState<unsigned_long,_true,_long>::BitpackingWriter::WriteFor
               (unsigned_long *values,bool *validity,bitpacking_width_t width,
               unsigned_long frame_of_reference,idx_t count,void *data_ptr)

{
  unsigned_long *puVar1;
  idx_t iVar2;
  undefined7 in_register_00000011;
  
  iVar2 = BitpackingPrimitives::GetRequiredSize(count,width);
  ReserveSpace((BitpackingCompressionState<unsigned_long,_true,_long> *)data_ptr,iVar2 + 0x10);
  WriteMetaData((BitpackingCompressionState<unsigned_long,_true,_long> *)data_ptr,FOR);
  puVar1 = *(unsigned_long **)((long)data_ptr + 0x40);
  *puVar1 = frame_of_reference;
  puVar1[1] = CONCAT71(in_register_00000011,width) & 0xffffffff;
  *(unsigned_long **)((long)data_ptr + 0x40) = puVar1 + 2;
  BitpackingPrimitives::PackBuffer<unsigned_long,false>((data_ptr_t)(puVar1 + 2),values,count,width)
  ;
  *(long *)((long)data_ptr + 0x40) = *(long *)((long)data_ptr + 0x40) + iVar2;
  UpdateStats((BitpackingCompressionState<unsigned_long,_true,_long> *)data_ptr,count);
  return;
}

Assistant:

static void WriteFor(T *values, bool *validity, bitpacking_width_t width, T frame_of_reference, idx_t count,
		                     void *data_ptr) {
			auto state = reinterpret_cast<BitpackingCompressionState<T, WRITE_STATISTICS> *>(data_ptr);

			auto bp_size = BitpackingPrimitives::GetRequiredSize(count, width);
			ReserveSpace(state, bp_size + 2 * sizeof(T));

			WriteMetaData(state, BitpackingMode::FOR);
			WriteData(state->data_ptr, frame_of_reference);
			WriteData(state->data_ptr, (T)width);

			BitpackingPrimitives::PackBuffer<T, false>(state->data_ptr, values, count, width);
			state->data_ptr += bp_size;

			UpdateStats(state, count);
		}